

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

void __thiscall
Lib::Map<Kernel::PolyNf,_Kernel::PolyNf,_Lib::DefaultHash>::clear
          (Map<Kernel::PolyNf,_Kernel::PolyNf,_Lib::DefaultHash> *this)

{
  Entry *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  if (*(long *)((long)&in_RDI->_key + 4) != 0) {
    array_delete<Lib::Map<Kernel::PolyNf,Kernel::PolyNf,Lib::DefaultHash>::Entry>
              (in_RDI,in_stack_ffffffffffffffe8);
    Lib::free(*(void **)((long)&in_RDI->_key + 4));
  }
  in_RDI->code = 0;
  (in_RDI->_key).__align = (anon_struct_4_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&in_RDI->_key + 4) = 0;
  *(undefined8 *)((long)&in_RDI->_key + 0xc) = 0;
  *(undefined4 *)((long)&in_RDI->_key + 0x14) = 0;
  return;
}

Assistant:

void clear()
  {
    if (_entries) {
      array_delete(_entries, _capacity);
      DEALLOC_KNOWN(_entries,sizeof(Entry)*_capacity,"Map<>");
    }
    _capacity    = 0;
    _noOfEntries = 0;
    _entries     = nullptr;
    _afterLast   = nullptr;
    _maxEntries  = 0;
  }